

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicationFactory.cpp
# Opt level: O2

unique_ptr<solitaire::interfaces::Context,_std::default_delete<solitaire::interfaces::Context>_>
__thiscall ApplicationFactory::makeContext(ApplicationFactory *this)

{
  _Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
  _Var1;
  _Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  _Var2;
  Position PVar3;
  unique_ptr<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  uVar4;
  PileId id;
  long lVar5;
  TableauPileColliders tableauPileColliders;
  FoundationPileColliders foundationPileColliders;
  Position local_d0;
  Position local_c8;
  undefined1 local_c0 [24];
  PileId local_a8;
  PileId local_a4;
  Position local_a0;
  array<std::unique_ptr<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>,_7UL>
  local_98;
  array<std::unique_ptr<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>,_4UL>
  local_58;
  
  makeSolitaire((ApplicationFactory *)local_c0);
  local_58._M_elems[2]._M_t.
  super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
  .super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
  _M_head_impl = (__uniq_ptr_data<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>,_true,_true>
                  )(__uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                    )0x0;
  local_58._M_elems[3]._M_t.
  super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
  .super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
  _M_head_impl = (__uniq_ptr_data<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>,_true,_true>
                  )(__uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                    )0x0;
  local_58._M_elems[0]._M_t.
  super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
  .super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
  _M_head_impl = (__uniq_ptr_data<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>,_true,_true>
                  )(__uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                    )0x0;
  local_58._M_elems[1]._M_t.
  super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
  .super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
  _M_head_impl = (__uniq_ptr_data<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>,_true,_true>
                  )(__uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                    )0x0;
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    local_a4.t = (uint)lVar5;
    local_d0 = solitaire::Layout::getFoundationPilePosition(&local_a4);
    std::make_unique<solitaire::colliders::FoundationPileCollider,solitaire::geometry::Position>
              ((Position *)&local_98);
    uVar4._M_t.
    super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
    ._M_t.
    super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
    .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
    _M_head_impl = (__uniq_ptr_data<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>,_true,_true>
                    )(__uniq_ptr_data<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>,_true,_true>
                      )local_98._M_elems[0];
    local_98._M_elems[0]._M_t.
    super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
    ._M_t.
    super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
    .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
    _M_head_impl = (__uniq_ptr_data<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>,_true,_true>
                    )(__uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                      )0x0;
    _Var1.super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
    _M_head_impl = local_58._M_elems[lVar5]._M_t.
                   super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                   .
                   super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>
    ;
    *(__uniq_ptr_data<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>,_true,_true>
      *)(local_58._M_elems + lVar5) =
         uVar4._M_t.
         super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
         ._M_t.
         super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
         .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
         _M_head_impl;
    if (_Var1.
        super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
        _M_head_impl != (FoundationPileCollider *)0x0) {
      (**(code **)(*(long *)_Var1.
                            super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>
                            ._M_head_impl + 8))();
      if ((Position)
          local_98._M_elems[0]._M_t.
          super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
          ._M_t.
          super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
          .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
          _M_head_impl != (Position)0x0) {
        (*(*(_func_int ***)
            local_98._M_elems[0]._M_t.
            super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
            ._M_t.
            super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
            .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
            _M_head_impl)[1])();
      }
    }
  }
  local_98._M_elems[4]._M_t.
  super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
  _M_head_impl = (__uniq_ptr_data<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>,_true,_true>
                  )(__uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                    )0x0;
  local_98._M_elems[5]._M_t.
  super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
  _M_head_impl = (__uniq_ptr_data<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>,_true,_true>
                  )(__uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                    )0x0;
  local_98._M_elems[2]._M_t.
  super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
  _M_head_impl = (__uniq_ptr_data<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>,_true,_true>
                  )(__uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                    )0x0;
  local_98._M_elems[3]._M_t.
  super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
  _M_head_impl = (__uniq_ptr_data<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>,_true,_true>
                  )(__uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                    )0x0;
  local_98._M_elems[0]._M_t.
  super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
  _M_head_impl = (__uniq_ptr_data<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>,_true,_true>
                  )(__uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                    )0x0;
  local_98._M_elems[1]._M_t.
  super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
  _M_head_impl = (__uniq_ptr_data<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>,_true,_true>
                  )(__uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                    )0x0;
  local_98._M_elems[6]._M_t.
  super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
  _M_head_impl = (__uniq_ptr_data<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>,_true,_true>
                  )(__uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                    )0x0;
  for (lVar5 = 0; lVar5 != 7; lVar5 = lVar5 + 1) {
    local_a8.t = (uint)lVar5;
    local_c8 = solitaire::Layout::getTableauPilePosition(&local_a8);
    local_c0._20_4_ = (uint)lVar5;
    (*(*(_func_int ***)local_c0._0_8_)[0xe])(local_c0._0_8_,local_c0 + 0x14);
    std::
    make_unique<solitaire::colliders::TableauPileCollider,solitaire::geometry::Position,solitaire::piles::interfaces::TableauPile_const&>
              (&local_d0,(TableauPile *)&local_c8);
    PVar3 = local_d0;
    local_d0.x = 0;
    local_d0.y = 0;
    _Var2.super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
    _M_head_impl = local_98._M_elems[lVar5]._M_t.
                   super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                   .
                   super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>
    ;
    *(Position *)(local_98._M_elems + lVar5) = PVar3;
    if (_Var2.super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
        _M_head_impl != (TableauPileCollider *)0x0) {
      (**(code **)(*(long *)_Var2.
                            super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>
                            ._M_head_impl + 8))();
      if (local_d0 != (Position)0x0) {
        (**(code **)(*(long *)local_d0 + 8))();
      }
    }
  }
  (*(*(_func_int ***)local_c0._0_8_)[0xf])();
  std::
  make_unique<solitaire::colliders::StockPileCollider,solitaire::piles::interfaces::StockPile_const&>
            ((StockPile *)&local_c8);
  std::
  make_unique<solitaire::Button,solitaire::geometry::Position_const&,solitaire::geometry::Size_const&>
            ((Position *)(local_c0 + 8),(Size *)&solitaire::Layout::newGameButtonPosition);
  std::
  make_unique<solitaire::Button,solitaire::geometry::Position_const&,solitaire::geometry::Size_const&>
            (&local_a0,(Size *)&solitaire::Layout::undoButtonPosition);
  std::
  make_unique<solitaire::Context,std::unique_ptr<solitaire::interfaces::Solitaire,std::default_delete<solitaire::interfaces::Solitaire>>,std::array<std::unique_ptr<solitaire::colliders::interfaces::FoundationPileCollider,std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>>,4ul>,std::array<std::unique_ptr<solitaire::colliders::interfaces::TableauPileCollider,std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>>,7ul>,std::unique_ptr<solitaire::colliders::StockPileCollider,std::default_delete<solitaire::colliders::StockPileCollider>>,std::unique_ptr<solitaire::Button,std::default_delete<solitaire::Button>>,std::unique_ptr<solitaire::Button,std::default_delete<solitaire::Button>>>
            ((unique_ptr<solitaire::interfaces::Solitaire,_std::default_delete<solitaire::interfaces::Solitaire>_>
              *)&local_d0,
             (array<std::unique_ptr<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>,_4UL>
              *)local_c0,
             (array<std::unique_ptr<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>,_7UL>
              *)&local_58,
             (unique_ptr<solitaire::colliders::StockPileCollider,_std::default_delete<solitaire::colliders::StockPileCollider>_>
              *)&local_98,
             (unique_ptr<solitaire::Button,_std::default_delete<solitaire::Button>_> *)&local_c8,
             (unique_ptr<solitaire::Button,_std::default_delete<solitaire::Button>_> *)
             (local_c0 + 8));
  PVar3 = local_d0;
  local_d0.x = 0;
  local_d0.y = 0;
  *(Position *)this = PVar3;
  if (local_a0 != (Position)0x0) {
    (**(code **)(*(long *)local_a0 + 8))();
  }
  if ((_Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>)
      local_c0._8_8_ !=
      (_Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>)0x0) {
    (*(*(_func_int ***)local_c0._8_8_)[1])();
  }
  if (local_c8 != (Position)0x0) {
    (**(code **)(*(long *)local_c8 + 8))();
  }
  std::
  array<std::unique_ptr<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>,_7UL>
  ::~array(&local_98);
  std::
  array<std::unique_ptr<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>,_4UL>
  ::~array(&local_58);
  if ((tuple<solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
       )local_c0._0_8_ !=
      (_Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>)0x0) {
    (*(*(_func_int ***)local_c0._0_8_)[1])();
  }
  return (__uniq_ptr_data<solitaire::interfaces::Context,_std::default_delete<solitaire::interfaces::Context>,_true,_true>
          )(__uniq_ptr_data<solitaire::interfaces::Context,_std::default_delete<solitaire::interfaces::Context>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<solitaire::interfaces::Context>
ApplicationFactory::makeContext() const
{
    auto solitaire = makeSolitaire();

    Context::FoundationPileColliders foundationPileColliders;
    for (PileId id {0}; id < Solitaire::foundationPilesCount; ++id)
        foundationPileColliders[id] =
            std::make_unique<FoundationPileCollider>(
                Layout::getFoundationPilePosition(id));

    Context::TableauPileColliders tableauPileColliders;
    for (PileId id {0}; id < Solitaire::tableauPilesCount; ++id)
        tableauPileColliders[id] =
            std::make_unique<TableauPileCollider>(
                Layout::getTableauPilePosition(id), solitaire->getTableauPile(id));

    return std::make_unique<Context>(
        std::move(solitaire), std::move(foundationPileColliders),
        std::move(tableauPileColliders),
        std::make_unique<StockPileCollider>(solitaire->getStockPile()),
        std::make_unique<Button>(
            Layout::newGameButtonPosition, Layout::newGameButtonSize
        ),
        std::make_unique<Button>(
            Layout::undoButtonPosition, Layout::undoButtonSize
        )
    );
}